

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.c
# Opt level: O2

void m2v_copy_col(m2v *M1,int c1,m2v *Mt,int ct)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  bVar2 = (byte)ct & 0x1f;
  for (iVar3 = 0; iVar3 < M1->n_row; iVar3 = iVar3 + 1) {
    iVar4 = Mt->row_stride * iVar3 + ct / 0x20;
    uVar1 = Mt->e[iVar4];
    uVar5 = uVar1 | 1 << ((byte)ct & 0x1f);
    if ((M1->e[M1->row_stride * iVar3 + c1 / 0x20] & 1 << ((byte)c1 & 0x1f)) == 0) {
      uVar5 = uVar1 & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
    }
    Mt->e[iVar4] = uVar5;
  }
  return;
}

Assistant:

void m2v_copy_col(const m2v* M1,
			int c1,
			m2v* Mt,
			int ct)
{
	assert(M1->n_row == Mt->n_row);
	assert(0 <= c1 && c1 < M1->n_col);
	assert(0 <= ct && ct < Mt->n_col);

	const m2v_base m1 = get_mask(get_bit(M1, c1));
	const m2v_base mt = get_mask(get_bit(Mt, ct));
	for (int i = 0; i < M1->n_row; ++i) {
		const m2v_base w1 = M1->e[get_word(M1, i, c1)];
		m2v_base* p = &Mt->e[get_word(Mt, i, ct)];
		if (w1 & m1) {
			*p |= mt;
		} else {
			*p &= ~mt;
		}
	}
}